

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

int gai_ComputeCountWithSkip
              (Integer ndim,Integer *lo,Integer *hi,Integer *skip,int *count,Integer *nstride)

{
  long lVar1;
  int istride;
  int i;
  Integer idx;
  Integer *nstride_local;
  int *count_local;
  Integer *skip_local;
  Integer *hi_local;
  Integer *lo_local;
  Integer ndim_local;
  
  *count = 1;
  istride = 1;
  i = 0;
  while( true ) {
    if ((int)ndim <= i) {
      *nstride = (long)istride;
      return 1;
    }
    lVar1 = hi[i] - lo[i];
    if (lVar1 < 0) break;
    if (skip[i] < 2) {
      count[istride] = (int)lVar1 + 1;
    }
    else {
      count[istride] = (int)(lVar1 / skip[i]) + 1;
    }
    istride = istride + 1;
    i = i + 1;
  }
  return 0;
}

Assistant:

int gai_ComputeCountWithSkip(Integer ndim, Integer *lo, Integer *hi,
                             Integer *skip, int *count, Integer *nstride)
{
#if 1
  Integer idx;
  int i, istride = 0;
  /*
  if (GAme==0) {
    printf("p[%d] ComputeCount lo[0]: %d hi[0]: %d lo[1]: %d hi[1]: %d\n",GAme,
        lo[0],hi[0],lo[1],hi[1]);
  }
  */
  count[0]=1;
  istride++;
  for (i=0; i<(int)ndim; i++) {
    idx = hi[i] - lo[i];
    if (idx < 0) return 0;
    if (skip[i] > 1) {
      count[istride] = (int)(idx/skip[i]+1);
      istride++;
    } else {
      count[istride] = (int)idx+1;
      istride++;
    }
  }
  *nstride = istride;
  return 1;
#else
  Integer idx;
  int i, istride = 0;
  /*
  if (GAme==0) {
    printf("p[%d] ComputeCount lo[0]: %d hi[0]: %d lo[1]: %d hi[1]: %d\n",GAme,
        lo[0],hi[0],lo[1],hi[1]);
  }
  */
  for (i=0; i<(int)ndim; i++) {
    idx = hi[i] - lo[i];
    if (idx < 0) return 0;
    if (skip[i] > 1) {
      count[istride] = 1;
      istride++;
      count[istride] = (int)(idx/skip[i]+1);
      istride++;
    } else {
      count[istride] = (int)idx+1;
      istride++;
    }
  }
  *nstride = istride;
  return 1;
#endif
}